

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_42055d::Db::parseTemplateParam(Db *this)

{
  char *pcVar1;
  ForwardTemplateReference **__src;
  Node **ppNVar2;
  bool bVar3;
  char *pcVar4;
  NameType *pNVar5;
  ForwardTemplateReference *pFVar6;
  ForwardTemplateReference **ppFVar7;
  ForwardTemplateReference **__dest;
  size_t __n;
  size_t Index;
  size_t local_38;
  
  pcVar4 = this->First;
  if (pcVar4 == this->Last) {
    return (Node *)0x0;
  }
  if (*pcVar4 != 'T') {
    return (Node *)0x0;
  }
  pcVar1 = pcVar4 + 1;
  this->First = pcVar1;
  local_38 = 0;
  if ((pcVar1 == this->Last) || (*pcVar1 != '_')) {
    bVar3 = parsePositiveInteger(this,&local_38);
    if (bVar3) {
      return (Node *)0x0;
    }
    local_38 = local_38 + 1;
    pcVar4 = this->First;
    if (pcVar4 == this->Last) {
      return (Node *)0x0;
    }
    if (*pcVar4 != '_') {
      return (Node *)0x0;
    }
    pcVar4 = pcVar4 + 1;
  }
  else {
    pcVar4 = pcVar4 + 2;
  }
  this->First = pcVar4;
  if (this->ParsingLambdaParams == true) {
    pNVar5 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[5]>
                       ((Db *)this,(char (*) [5])"auto");
    return &pNVar5->super_Node;
  }
  if (this->PermitForwardTemplateReferences != true) {
    ppNVar2 = (this->TemplateParams).First;
    if ((ulong)((long)(this->TemplateParams).Last - (long)ppNVar2 >> 3) <= local_38) {
      return (Node *)0x0;
    }
    return ppNVar2[local_38];
  }
  pFVar6 = (ForwardTemplateReference *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
  (pFVar6->super_Node).K = KForwardTemplateReference;
  (pFVar6->super_Node).RHSComponentCache = Unknown;
  (pFVar6->super_Node).ArrayCache = Unknown;
  (pFVar6->super_Node).FunctionCache = Unknown;
  (pFVar6->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001ea760;
  pFVar6->Index = local_38;
  pFVar6->Ref = (Node *)0x0;
  pFVar6->Printing = false;
  ppFVar7 = (this->ForwardTemplateRefs).Last;
  if (ppFVar7 == (this->ForwardTemplateRefs).Cap) {
    __src = (this->ForwardTemplateRefs).First;
    __n = (long)ppFVar7 - (long)__src;
    if (__src == (this->ForwardTemplateRefs).Inline) {
      __dest = (ForwardTemplateReference **)malloc(__n * 2);
      if (__dest == (ForwardTemplateReference **)0x0) goto LAB_0019a839;
      if (ppFVar7 != __src) {
        memmove(__dest,__src,__n);
      }
      (this->ForwardTemplateRefs).First = __dest;
    }
    else {
      ppFVar7 = (ForwardTemplateReference **)realloc(__src,__n * 2);
      (this->ForwardTemplateRefs).First = ppFVar7;
      if (ppFVar7 == (ForwardTemplateReference **)0x0) {
LAB_0019a839:
        std::terminate();
      }
    }
    ppFVar7 = (this->ForwardTemplateRefs).First;
    (this->ForwardTemplateRefs).Last = (ForwardTemplateReference **)((long)ppFVar7 + __n);
    (this->ForwardTemplateRefs).Cap = ppFVar7 + ((long)__n >> 2);
  }
  ppFVar7 = (this->ForwardTemplateRefs).Last;
  (this->ForwardTemplateRefs).Last = ppFVar7 + 1;
  *ppFVar7 = pFVar6;
  ppFVar7 = (this->ForwardTemplateRefs).Last;
  if (ppFVar7 == (this->ForwardTemplateRefs).First) {
    __assert_fail("Last != First && \"Calling back() on empty vector!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x78a,
                  "T &(anonymous namespace)::PODSmallVector<(anonymous namespace)::ForwardTemplateReference *, 4>::back() [T = (anonymous namespace)::ForwardTemplateReference *, N = 4]"
                 );
  }
  return &ppFVar7[-1]->super_Node;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }